

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O0

Node * __thiscall wasm::DataFlow::Graph::expandFromI1(Graph *this,Node *node,Expression *origin)

{
  bool bVar1;
  Node *node_00;
  Expression *origin_local;
  Node *node_local;
  Graph *this_local;
  
  bVar1 = Node::isBad(node);
  origin_local = (Expression *)node;
  if ((!bVar1) && (bVar1 = Node::returnsI1(node), bVar1)) {
    node_00 = Node::makeZext(node,origin);
    origin_local = (Expression *)addNode(this,node_00);
  }
  return (Node *)origin_local;
}

Assistant:

Node* expandFromI1(Node* node, Expression* origin) {
    if (!node->isBad() && node->returnsI1()) {
      node = addNode(Node::makeZext(node, origin));
    }
    return node;
  }